

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_store_scalar_null(Parser *this,char *str)

{
  code *pcVar1;
  csubstr s;
  bool bVar2;
  error_flags eVar3;
  ulong in_RSI;
  long in_RDI;
  char msg [59];
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  Location *in_stack_ffffffffffffff40;
  flag_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uStack_78;
  undefined4 uStack_74;
  char *local_70;
  undefined1 local_68 [88];
  ulong *local_10;
  long *local_8;
  
  local_10 = (ulong *)(in_RDI + 0x18);
  if ((in_RSI < *local_10) ||
     (local_8 = (long *)(in_RDI + 0x18), (ulong)(*local_8 + *(long *)(in_RDI + 0x20)) < in_RSI)) {
    memcpy(local_68,"check failed: (str >= m_buf.begin() && str <= m_buf.end())",0x3b);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    (*pcVar1)(local_68,0x3b,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_ffffffffffffff30 = uStack_78;
    in_stack_ffffffffffffff34 = uStack_74;
    in_stack_ffffffffffffff38 = local_70;
  }
  basic_substring<const_char>::basic_substring
            ((basic_substring<const_char> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  s.str._4_4_ = in_stack_ffffffffffffff7c;
  s.str._0_4_ = in_stack_ffffffffffffff78;
  s.len._0_4_ = in_stack_ffffffffffffff80;
  s.len._4_4_ = in_stack_ffffffffffffff84;
  _store_scalar((Parser *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),s,
                in_stack_ffffffffffffff6c);
  return;
}

Assistant:

inline void      _store_scalar_null(const char *str) {  _RYML_CB_ASSERT(m_stack.m_callbacks, str >= m_buf.begin() && str <= m_buf.end()); _store_scalar({nullptr, size_t(0)}, false); }